

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          StringTree *params_1,ArrayPtr<const_char> *params_2)

{
  char *pcVar1;
  Branch *pBVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  Branch *pBVar5;
  char *pcVar6;
  String local_48;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  pcVar6 = (this->text).content.ptr;
  pcVar1 = (params_1->text).content.ptr;
  __return_storage_ptr__->size_ = (size_t)(params->ptr + (long)(pcVar1 + (long)pcVar6));
  heapString(&local_48,(size_t)(pcVar1 + (long)pcVar6));
  (__return_storage_ptr__->text).content.ptr = local_48.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_48.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_48.content.disposer;
  pBVar5 = (Branch *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x40,1,1,kj::_::HeapArrayDisposer::Allocate_<kj::StringTree::Branch>::
                               construct,ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  local_48.content.size_ = 1;
  local_48.content.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_48.content.ptr = (char *)pBVar5;
  if (pBVar2 != (Branch *)0x0) {
    sVar3 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar4 = (__return_storage_ptr__->branches).disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pBVar2,0x40,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = pBVar5;
  (__return_storage_ptr__->branches).size_ = 1;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance
  ;
  pcVar6 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar6 != (char *)0x0) {
    pcVar6 = (__return_storage_ptr__->text).content.ptr;
  }
  pcVar1 = (this->text).content.ptr;
  if (pcVar1 != (char *)0x0) {
    memcpy(pcVar6,(void *)this->size_,(size_t)pcVar1);
    pcVar6 = pcVar6 + (long)pcVar1;
  }
  fill<kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pcVar6,0,(StringTree *)params,(ArrayPtr<const_char> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}